

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O1

bool __thiscall
cfgfile::lexical_analyzer_t<cfgfile::string_trait_t>::process_back_slash
          (lexical_analyzer_t<cfgfile::string_trait_t> *this,char_t *ch)

{
  bool bVar1;
  char_t cVar2;
  char *pcVar3;
  exception_t<cfgfile::string_trait_t> *this_00;
  char cVar4;
  pos_t pos;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 *local_150;
  long local_148;
  undefined1 local_140 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 *local_110;
  long local_108;
  undefined1 local_100 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string_t local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = input_stream_t<cfgfile::string_trait_t>::at_end(this->m_stream);
  if (bVar1) {
    this_00 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    local_110 = local_100;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "Unexpected end of file. Unfinished back slash sequence. In file \"","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_110,local_110 + local_108);
    std::operator+(&local_b0,&local_f0,&this->m_stream->m_file_name);
    local_150 = local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"\" on line ","");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_150,local_150 + local_148);
    std::operator+(&local_90,&local_b0,&local_130);
    string_trait_t::to_string_abi_cxx11_
              (&local_d0,(string_trait_t *)this->m_stream->m_line_number,pos);
    std::operator+(&local_70,&local_90,&local_d0);
    local_190 = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,".","");
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_170,local_190,local_190 + local_188);
    std::operator+(&local_50,&local_70,&local_170);
    exception_t<cfgfile::string_trait_t>::exception_t(this_00,&local_50);
    __cxa_throw(this_00,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  cVar2 = input_stream_t<cfgfile::string_trait_t>::get(this->m_stream);
  *ch = cVar2;
  if (cVar2 == const_t<cfgfile::string_trait_t>::c_n) {
    pcVar3 = &const_t<cfgfile::string_trait_t>::c_carriage_return;
  }
  else if (cVar2 == const_t<cfgfile::string_trait_t>::c_t) {
    pcVar3 = &const_t<cfgfile::string_trait_t>::c_tab;
  }
  else {
    if (cVar2 != const_t<cfgfile::string_trait_t>::c_r) {
      cVar4 = const_t<cfgfile::string_trait_t>::c_quotes;
      if ((cVar2 != const_t<cfgfile::string_trait_t>::c_quotes) &&
         (cVar4 = const_t<cfgfile::string_trait_t>::c_back_slash,
         cVar2 != const_t<cfgfile::string_trait_t>::c_back_slash)) {
        return false;
      }
      goto LAB_0012f2db;
    }
    pcVar3 = &const_t<cfgfile::string_trait_t>::c_line_feed;
  }
  cVar4 = *pcVar3;
LAB_0012f2db:
  *ch = cVar4;
  return true;
}

Assistant:

bool process_back_slash( typename Trait::char_t & ch )
	{
		if( m_stream.at_end() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"Unfinished back slash sequence. In file \"" ) +
				m_stream.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_stream.line_number() ) +
				Trait::from_ascii( "." ) );

		ch = m_stream.get();

		if( ch == const_t< Trait >::c_n )
			ch = const_t< Trait >::c_carriage_return;
		else if( ch == const_t< Trait >::c_t )
			ch = const_t< Trait >::c_tab;
		else if( ch == const_t< Trait >::c_r )
			ch = const_t< Trait >::c_line_feed;
		else if( ch == const_t< Trait >::c_quotes )
			ch = const_t< Trait >::c_quotes;
		else if( ch == const_t< Trait >::c_back_slash )
			ch = const_t< Trait >::c_back_slash;
		else
			return false;

		return true;
	}